

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_force_ip.cc
# Opt level: O0

int runForceIP(string *command,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  reference this;
  int in_ESI;
  undefined8 in_RDI;
  ostream *unaff_retaddr;
  ForceIP force_ip;
  DeviceInfo *device;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  string answer;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  exception *anon_var_0_2;
  exception *anon_var_0_1;
  exception *anon_var_0;
  array<unsigned_char,_4UL> gateway;
  array<unsigned_char,_4UL> mask;
  array<unsigned_char,_4UL> ip;
  invalid_argument *ex;
  string p;
  int i;
  bool yes;
  DeviceFilter device_filter;
  string *in_stack_fffffffffffffcc8;
  DeviceFilter *in_stack_fffffffffffffcd0;
  type in_stack_fffffffffffffce0;
  type in_stack_fffffffffffffce4;
  string *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  ostream *in_stack_fffffffffffffd90;
  DeviceFilter *in_stack_fffffffffffffe18;
  __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  local_1e0;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *local_1d8;
  DeviceFilter *in_stack_fffffffffffffe30;
  char **in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_1b0;
  allocator<char> local_189;
  string local_188 [36];
  _Type local_164;
  allocator<char> local_151;
  string local_150 [36];
  _Type local_12c;
  allocator<char> local_119;
  string local_118 [36];
  _Type local_f4;
  _Type local_f0;
  _Type local_ec;
  _Type local_e8;
  int local_e4;
  allocator<char> local_c1;
  string local_c0 [32];
  int local_a0;
  byte local_99;
  undefined1 local_98 [24];
  undefined1 auStack_80 [24];
  undefined1 auStack_68 [24];
  undefined1 auStack_50 [24];
  undefined1 auStack_38 [36];
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  local_14 = in_ESI;
  memset(local_98,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x136177);
  memset(auStack_80,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1361a4);
  memset(auStack_68,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1361d1);
  memset(auStack_50,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1361fe);
  memset(auStack_38,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13622b);
  local_99 = 0;
  local_a0 = 0;
  do {
    if (local_14 <= local_a0) goto LAB_0013663d;
    local_a0 = local_a0 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (allocator<char> *)in_stack_fffffffffffffd00);
    std::allocator<char>::~allocator(&local_c1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
    if (bVar1) {
      local_99 = 1;
LAB_001365e9:
      local_e4 = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
      if (bVar1) {
        iVar2 = parseFilterArguments
                          (in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
                           in_stack_fffffffffffffe30);
        local_a0 = iVar2 + local_a0;
        goto LAB_001365e9;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8),
         bVar1)) {
        printHelp((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        in_stack_fffffffffffffffc = 0;
        local_e4 = 1;
      }
      else {
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_c0), *pcVar4 == '-')) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
          in_stack_fffffffffffffd90 = std::operator<<(poVar5,local_c0);
          std::operator<<(in_stack_fffffffffffffd90,'\n');
          printHelp((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffffc = 1;
          local_e4 = 1;
        }
        else {
          local_a0 = local_a0 + -1;
          local_e4 = 3;
        }
      }
    }
    std::__cxx11::string::~string(local_c0);
    in_stack_fffffffffffffd8c = local_e4;
  } while (local_e4 == 0);
  if (local_e4 != 3) goto LAB_00137033;
LAB_0013663d:
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  if (((bVar1) &&
      (bVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)), bVar1)) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)), bVar1)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"No filter set");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    printHelp((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    in_stack_fffffffffffffffc = 1;
    local_e4 = 1;
    goto LAB_00137033;
  }
  if (local_a0 + 3 != local_14) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "IP address, subnet mask and default gateway must be set");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    printHelp((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    in_stack_fffffffffffffffc = 1;
    local_e4 = 1;
    goto LAB_00137033;
  }
  local_a0 = local_a0 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (allocator<char> *)in_stack_fffffffffffffd00);
  local_f4 = (_Type)string2ip(in_stack_fffffffffffffcc8);
  local_e8 = local_f4;
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_a0 = local_a0 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (allocator<char> *)in_stack_fffffffffffffd00);
  local_12c = (_Type)string2ip(in_stack_fffffffffffffcc8);
  local_ec = local_12c;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  local_a0 = local_a0 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (allocator<char> *)in_stack_fffffffffffffd00);
  local_164 = (_Type)string2ip(in_stack_fffffffffffffcc8);
  local_f0 = local_164;
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  discoverWithFilter(in_stack_fffffffffffffe18);
  bVar1 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::empty
                    ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"No device found");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffffffc = 0;
    local_e4 = 1;
  }
  else {
    sVar6 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::size
                      (&local_1b0);
    if (sVar6 < 2) {
      std::operator<<((ostream *)&std::cout,"Setting the IP address of the following device:\n");
      printDeviceTable(unaff_retaddr,
                       (vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
                       SUB81((ulong)in_RDI >> 0x28,0));
      if ((local_99 & 1) == 0) {
        std::operator<<((ostream *)&std::cout,"Are you sure? [y/N] ");
        in_stack_fffffffffffffd00 = (string *)&stack0xfffffffffffffe30;
        std::__cxx11::string::string(in_stack_fffffffffffffd00);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,in_stack_fffffffffffffd00);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
        if ((bVar1) &&
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8),
           bVar1)) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Cancel");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          in_stack_fffffffffffffffc = 0;
          local_e4 = 1;
        }
        else {
          local_e4 = 0;
        }
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
        if (local_e4 != 0) goto LAB_00137015;
      }
      local_1d8 = &local_1b0;
      local_1e0._M_current =
           (DeviceInfo *)
           std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                     ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                      in_stack_fffffffffffffcc8);
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                 in_stack_fffffffffffffcc8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                 *)in_stack_fffffffffffffcd0,
                                (__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                 *)in_stack_fffffffffffffcc8), bVar1) {
        this = __gnu_cxx::
               __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
               ::operator*(&local_1e0);
        rcdiscover::ForceIP::ForceIP((ForceIP *)in_stack_fffffffffffffd00);
        rcdiscover::DeviceInfo::getMAC(this);
        in_stack_fffffffffffffce4 =
             byteArrayToInt<4ul>((array<unsigned_char,_4UL> *)in_stack_fffffffffffffcd0);
        in_stack_fffffffffffffce0 =
             byteArrayToInt<4ul>((array<unsigned_char,_4UL> *)in_stack_fffffffffffffcd0);
        byteArrayToInt<4ul>((array<unsigned_char,_4UL> *)in_stack_fffffffffffffcd0);
        rcdiscover::ForceIP::sendCommand
                  ((ForceIP *)in_stack_fffffffffffffd90,
                   CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffd80,
                   (uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20));
        rcdiscover::ForceIP::~ForceIP((ForceIP *)0x136f9d);
        __gnu_cxx::
        __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
        ::operator++(&local_1e0);
      }
      in_stack_fffffffffffffcd0 = (DeviceFilter *)std::operator<<((ostream *)&std::cout,"Done");
      std::ostream::operator<<(in_stack_fffffffffffffcd0,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffffffc = 0;
      local_e4 = 1;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Found more than one device matching the filter criteria.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      printDeviceTable(unaff_retaddr,
                       (vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
                       SUB81((ulong)in_RDI >> 0x28,0));
      in_stack_fffffffffffffffc = 0;
      local_e4 = 1;
    }
  }
LAB_00137015:
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
LAB_00137033:
  DeviceFilter::~DeviceFilter(in_stack_fffffffffffffcd0);
  return in_stack_fffffffffffffffc;
}

Assistant:

int runForceIP(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else if (!p.empty() && p[0] == '-')
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
    else
    {
      --i;
      break;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  if (i + 3 != argc)
  {
    std::cerr << "IP address, subnet mask and default gateway must be set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  std::array<uint8_t, 4> ip;
  std::array<uint8_t, 4> mask;
  std::array<uint8_t, 4> gateway;

  try
  {
    ip = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse IP address" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    mask = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse subnet mask" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    gateway = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse default gateway" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  if (devices.size() > 1)
  {
    std::cout << "Found more than one device matching the filter criteria." << std::endl;
    printDeviceTable(std::cout, devices, true, false, false);
    return 0;
  }

  std::cout << "Setting the IP address of the following device:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::ForceIP force_ip;
    force_ip.sendCommand(device.getMAC(),
                         byteArrayToInt(ip),
                         byteArrayToInt(mask),
                         byteArrayToInt(gateway));
  }

  std::cout << "Done" << std::endl;

  return 0;
}